

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocketnotifier.cpp
# Opt level: O3

void __thiscall QSocketNotifier::QSocketNotifier(QSocketNotifier *this,Type type,QObject *parent)

{
  QObjectData *pQVar1;
  QObjectPrivate *this_00;
  
  this_00 = (QObjectPrivate *)operator_new(0x88);
  QObjectPrivate::QObjectPrivate(this_00,QObjectPrivateVersion);
  (this_00->super_QObjectData)._vptr_QObjectData = (_func_int **)&PTR__QObjectPrivate_0069b8b8;
  *(undefined4 *)&this_00[1].super_QObjectData._vptr_QObjectData = 0xffffffff;
  *(undefined1 *)&this_00[1].super_QObjectData.q_ptr = 0;
  QObject::QObject(&this->super_QObject,this_00,parent);
  (this->super_QObject)._vptr_QObject = (_func_int **)&PTR_metaObject_0069b7a8;
  pQVar1 = (this->super_QObject).d_ptr.d;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QSocketDescriptor>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    QMetaType::registerHelper(&QtPrivate::QMetaTypeInterfaceWrapper<QSocketDescriptor>::metaType);
  }
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QSocketNotifier::Type>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    QMetaType::registerHelper
              (&QtPrivate::QMetaTypeInterfaceWrapper<QSocketNotifier::Type>::metaType);
  }
  *(Type *)((long)&pQVar1[1].children.d.size + 4) = type;
  return;
}

Assistant:

QSocketNotifier::QSocketNotifier(Type type, QObject *parent)
    : QObject(*new QSocketNotifierPrivate, parent)
{
    Q_D(QSocketNotifier);

    qRegisterMetaType<QSocketDescriptor>();
    qRegisterMetaType<QSocketNotifier::Type>();

    d->sntype = type;
}